

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_type_predicate_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type)

{
  sexp psVar1;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp in_R8;
  sexp unaff_retaddr;
  sexp in_stack_00000008;
  sexp_proc1 in_stack_00000010;
  sexp in_stack_ffffffffffffffa8;
  sexp_uint_t in_stack_ffffffffffffffb0;
  sexp in_stack_ffffffffffffffb8;
  sexp in_stack_ffffffffffffffc0;
  sexp local_30;
  sexp in_stack_fffffffffffffff8;
  
  local_30 = in_R8;
  if ((((ulong)in_R8 & 3) == 0) && (in_R8->tag == 1)) {
    local_30 = (sexp)((ulong)(in_R8->value).type.tag << 1 | 1);
  }
  if (((ulong)local_30 & 1) == 1) {
    psVar1 = sexp_make_opcode((sexp)0x0,(sexp)0x0,local_30,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                              (sexp)&DAT_00000001,in_RDX,in_RSI,in_RDI,in_stack_fffffffffffffff8,
                              unaff_retaddr,in_stack_00000008,in_stack_00000010);
  }
  else {
    psVar1 = sexp_type_exception(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return psVar1;
}

Assistant:

sexp sexp_make_type_predicate_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type) {
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, type);
  return sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_TYPE_PREDICATE),
                          sexp_make_fixnum(SEXP_OP_TYPEP), SEXP_ONE, SEXP_ZERO,
                          SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, type, NULL, NULL);
}